

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Benchmark::Detail::BenchmarkFunction::
model<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/extent_tests.cpp:199:5)>
::call(model<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_extent_tests_cpp:199:5)>
       *this,Chronometer meter)

{
  double width;
  double height;
  PolarExtent *this_00;
  Vector3d *pVVar1;
  int iVar2;
  ChronometerConcept *pCVar3;
  bool bVar4;
  Vector3d local_68;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_48 [24];
  
  pCVar3 = meter.impl;
  (**pCVar3->_vptr_ChronometerConcept)(pCVar3);
  iVar2 = meter.k;
  if (meter.k < 1) {
    iVar2 = 0;
  }
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    this_00 = (this->fun).extentPanner;
    pVVar1 = (this->fun).pos;
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
    width = *(this->fun).width;
    height = *(this->fun).height;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_48,&((this->fun).pvs)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0)
    ;
    ear::PolarExtent::handle
              (this_00,&local_68,width,height,0.0,
               (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_48);
  }
  (*pCVar3->_vptr_ChronometerConcept[1])(pCVar3);
  return;
}

Assistant:

void call(Chronometer meter) const override {
                        call(meter, is_callable<Fun(Chronometer)>());
                    }